

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.cxx
# Opt level: O2

bool __thiscall
cmAuxSourceDirectoryCommand::InitialPass
          (cmAuxSourceDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmCommand *pcVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  unsigned_long uVar6;
  long lVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  cmSourceFile *this_00;
  unsigned_long dindex;
  allocator local_151;
  cmCommand *local_150;
  Directory dir;
  string sourceListValue;
  string tdir;
  string templateDirectory;
  string file;
  string fullname;
  string base;
  string ext;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  local_150 = &this->super_cmCommand;
  if (lVar4 == 0x40) {
    sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&templateDirectory,(string *)pbVar1);
    tdir._M_dataplus._M_p = (pointer)&tdir.field_2;
    tdir._M_string_length = 0;
    tdir.field_2._M_local_buf[0] = '\0';
    bVar3 = cmsys::SystemTools::FileIsFullPath(templateDirectory._M_dataplus._M_p);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&tdir);
    }
    else {
      cmMakefile::GetCurrentSourceDirectory(local_150->Makefile);
      std::__cxx11::string::assign((char *)&tdir);
      std::__cxx11::string::append((char *)&tdir);
      std::__cxx11::string::append((string *)&tdir);
    }
    pcVar5 = cmMakefile::GetDefinition
                       (local_150->Makefile,
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&sourceListValue);
    }
    cmsys::Directory::Directory(&dir);
    std::__cxx11::string::string((string *)&file,tdir._M_dataplus._M_p,(allocator *)&ext);
    bVar3 = cmsys::Directory::Load(&dir,&file);
    std::__cxx11::string::~string((string *)&file);
    if (bVar3) {
      uVar6 = cmsys::Directory::GetNumberOfFiles(&dir);
      for (dindex = 0; uVar6 != dindex; dindex = dindex + 1) {
        pcVar5 = cmsys::Directory::GetFile(&dir,dindex);
        std::__cxx11::string::string((string *)&file,pcVar5,(allocator *)&ext);
        lVar7 = std::__cxx11::string::rfind((char *)&file,0x46a2b5);
        if (lVar7 != -1) {
          std::__cxx11::string::substr((ulong)&ext,(ulong)&file);
          std::__cxx11::string::substr((ulong)&base,(ulong)&file);
          pcVar2 = local_150;
          if (base._M_string_length != 0) {
            _Var8 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((local_150->Makefile->SourceFileExtensions).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (local_150->Makefile->SourceFileExtensions).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,&ext);
            if (_Var8._M_current !=
                (pcVar2->Makefile->SourceFileExtensions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string((string *)&fullname,(string *)&templateDirectory);
              std::__cxx11::string::append((char *)&fullname);
              std::__cxx11::string::append((string *)&fullname);
              this_00 = cmMakefile::GetOrCreateSource(local_150->Makefile,&fullname,false);
              std::__cxx11::string::string((string *)&local_50,"ABSTRACT",&local_151);
              cmSourceFile::SetProperty(this_00,&local_50,"0");
              std::__cxx11::string::~string((string *)&local_50);
              if (sourceListValue._M_string_length != 0) {
                std::__cxx11::string::append((char *)&sourceListValue);
              }
              std::__cxx11::string::append((string *)&sourceListValue);
              std::__cxx11::string::~string((string *)&fullname);
            }
          }
          std::__cxx11::string::~string((string *)&base);
          std::__cxx11::string::~string((string *)&ext);
        }
        std::__cxx11::string::~string((string *)&file);
      }
    }
    cmMakefile::AddDefinition
              (local_150->Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,sourceListValue._M_dataplus._M_p);
    cmsys::Directory::~Directory(&dir);
    std::__cxx11::string::~string((string *)&tdir);
    std::__cxx11::string::~string((string *)&templateDirectory);
  }
  else {
    std::__cxx11::string::string
              ((string *)&sourceListValue,"called with incorrect number of arguments",
               (allocator *)&templateDirectory);
    cmCommand::SetError(local_150,&sourceListValue);
  }
  std::__cxx11::string::~string((string *)&sourceListValue);
  return lVar4 == 0x40;
}

Assistant:

bool cmAuxSourceDirectoryCommand::InitialPass
(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 || args.size() > 2)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string sourceListValue;
  std::string templateDirectory = args[0];
  std::string tdir;
  if(!cmSystemTools::FileIsFullPath(templateDirectory.c_str()))
    {
    tdir = this->Makefile->GetCurrentSourceDirectory();
    tdir += "/";
    tdir += templateDirectory;
    }
  else
    {
    tdir = templateDirectory;
    }

  // was the list already populated
  const char *def = this->Makefile->GetDefinition(args[1]);
  if (def)
    {
    sourceListValue = def;
    }

  // Load all the files in the directory
  cmsys::Directory dir;
  if(dir.Load(tdir.c_str()))
    {
    size_t numfiles = dir.GetNumberOfFiles();
    for(size_t i =0; i < numfiles; ++i)
      {
      std::string file = dir.GetFile(static_cast<unsigned long>(i));
      // Split the filename into base and extension
      std::string::size_type dotpos = file.rfind(".");
      if( dotpos != std::string::npos )
        {
        std::string ext = file.substr(dotpos+1);
        std::string base = file.substr(0, dotpos);
        // Process only source files
        if(!base.empty()
            && std::find( this->Makefile->GetSourceExtensions().begin(),
                          this->Makefile->GetSourceExtensions().end(), ext )
                 != this->Makefile->GetSourceExtensions().end() )
          {
          std::string fullname = templateDirectory;
          fullname += "/";
          fullname += file;
          // add the file as a class file so
          // depends can be done
          cmSourceFile* sf =
            this->Makefile->GetOrCreateSource(fullname);
          sf->SetProperty("ABSTRACT","0");
          if(!sourceListValue.empty())
            {
            sourceListValue += ";";
            }
          sourceListValue += fullname;
          }
        }
      }
    }
  this->Makefile->AddDefinition(args[1], sourceListValue.c_str());
  return true;
}